

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_function_primitive_hasOverrideDispatch
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_bitflags_t sVar1;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
    closure = argumentCount;
  }
  sVar1 = sysbvm_function_getFlags((sysbvm_context_t *)*arguments,closure);
  return (ulong)((byte)(sVar1 >> 7) & 1) << 4 | 0xf;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_hasOverrideDispatch(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    size_t flags = sysbvm_function_getFlags(context, *function);
    return sysbvm_tuple_boolean_encode((flags & SYSBVM_FUNCTION_FLAGS_OVERRIDE) != 0);
}